

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

unqlite_kv_methods * unqliteFindKVStore(char *zName,sxu32 nByte)

{
  unqlite_kv_methods *puVar1;
  char *zSrc;
  void *pvVar2;
  sxu32 sVar3;
  sxi32 sVar4;
  ulong uVar5;
  ulong uVar6;
  
  pvVar2 = sUnqlMPGlobal.kv_storage.pBase;
  uVar5 = (ulong)sUnqlMPGlobal.kv_storage.nUsed;
  uVar6 = 0;
  while( true ) {
    if (uVar5 == uVar6) {
      return (unqlite_kv_methods *)0x0;
    }
    puVar1 = *(unqlite_kv_methods **)((long)pvVar2 + uVar6 * 8);
    zSrc = puVar1->zName;
    sVar3 = SyStrlen(zSrc);
    if ((sVar3 == nByte) && (sVar4 = SyStrnicmp(zSrc,zName,nByte), sVar4 == 0)) break;
    uVar6 = uVar6 + 1;
  }
  return puVar1;
}

Assistant:

UNQLITE_PRIVATE unqlite_kv_methods * unqliteFindKVStore(
	const char *zName, /* Storage engine name [i.e. Hash, B+tree, LSM, etc.] */
	sxu32 nByte /* zName length */
	)
{
	unqlite_kv_methods **apStore,*pEntry;
	sxu32 n,nMax;
	/* Point to the set of installed engines */
	apStore = (unqlite_kv_methods **)SySetBasePtr(&sUnqlMPGlobal.kv_storage);
	nMax = SySetUsed(&sUnqlMPGlobal.kv_storage);
	for( n = 0 ; n < nMax; ++n ){
		pEntry = apStore[n];
		if( nByte == SyStrlen(pEntry->zName) && SyStrnicmp(pEntry->zName,zName,nByte) == 0 ){
			/* Storage engine found */
			return pEntry;
		}
	}
	/* No such entry, return NULL */
	return 0;
}